

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analysis.cc
# Opt level: O3

bool kratos::LatchVisitor::check_stmt_block(StmtBlock *stmt,Var *var,bool full_branch)

{
  bool bVar1;
  _Any_data local_30;
  code *local_20;
  code *local_18;
  
  local_30._8_8_ = 0;
  local_18 = std::
             _Function_handler<bool_(kratos::Stmt_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/Kuree[P]kratos/src/analysis.cc:538:13)>
             ::_M_invoke;
  local_20 = std::
             _Function_handler<bool_(kratos::Stmt_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/Kuree[P]kratos/src/analysis.cc:538:13)>
             ::_M_manager;
  local_30._M_unused._M_object = var;
  bVar1 = check_stmt_condition
                    (&stmt->super_Stmt,(function<bool_(kratos::Stmt_*)> *)&local_30,false,
                     full_branch);
  if (local_20 != (code *)0x0) {
    (*local_20)(&local_30,&local_30,__destroy_functor);
  }
  return bVar1;
}

Assistant:

bool static check_stmt_block(StmtBlock* stmt, Var* var, bool full_branch) {
        return check_stmt_condition(
            stmt,
            [=](Stmt* s) -> bool {
                if (s->type() == StatementType::Assign) {
                    auto assign = s->as<AssignStmt>();
                    return assign->left() == var;
                }
                return false;
            },
            false, full_branch);
    }